

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

Node * __thiscall Parser::identifier(Parser *this)

{
  Token *this_00;
  Node *this_01;
  string variable_str;
  string local_78;
  string local_58;
  string local_38;
  
  eat_abi_cxx11_(&local_38,this,IDENTIFIER);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  this_00 = Lexer::current_token(this->lex);
  Token::get_lexeme_abi_cxx11_(&local_58,this_00);
  Lexer::next_token(this->lex);
  this_01 = (Node *)operator_new(0x48);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_58._M_dataplus._M_p,
             local_58._M_dataplus._M_p + local_58._M_string_length);
  Node::Node(this_01,VARIABLE,(Node *)0x0,(Node *)0x0,&local_78,(Node *)0x0,(Node *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return this_01;
}

Assistant:

Node* Parser::identifier()
{
	eat(token_type::IDENTIFIER);

	string variable_str = lex->current_token()->get_lexeme();
	lex->next_token();

	Node* identifier_node = new Node(node_type::VARIABLE, nullptr, nullptr, variable_str);
	return identifier_node;
}